

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwWindowHintPointer(int hint,void *value)

{
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (hint == 0x2000a) {
    _glfw.hints.window.nativeParent = value;
    return;
  }
  _glfwInputError(0x10003,"Invalid window hint %i",hint);
  return;
}

Assistant:

GLFWAPI void glfwWindowHintPointer(int hint, void* value)
{
    _GLFW_REQUIRE_INIT();

    switch (hint)
    {
        case GLFW_NATIVE_PARENT_HANDLE:
	        _glfw.hints.window.nativeParent = value;
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, "Invalid window hint %i", hint);
            break;
    }
}